

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O2

void cali_begin_region(char *name)

{
  Caliper c;
  cali_variant_t local_40;
  Caliper local_30;
  
  cali::Caliper::Caliper(&local_30);
  local_40 = cali_make_variant_from_string(name);
  cali::Caliper::begin(&local_30,(Attribute *)&cali::region_attr,(Variant *)&local_40);
  return;
}

Assistant:

void cali_begin_region(const char* name)
{
    Caliper c;
    c.begin(cali::region_attr, Variant(name));
}